

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::find
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,peek peek)

{
  undefined1 auVar1 [12];
  int iVar2;
  time_point now;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    oVar4 = do_find(this,key,now,peek);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    auVar1 = oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._0_12_;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._12_4_ = 0;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)auVar1._0_8_;
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = (bool)auVar1[8];
    oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_3_ = auVar1._9_3_;
    return (optional<unsigned_long>)
           oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

auto find(const key_type& key, peek peek = peek::no) -> std::optional<value_type>
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};
        return do_find(key, now, peek);
    }